

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O3

char * scanf_fmtstr(char *src,char *type)

{
  ushort **ppuVar1;
  char *pcVar2;
  int iVar3;
  char cVar4;
  char *pcVar5;
  int rd;
  char i32 [6];
  int local_3c;
  char local_38 [8];
  
  cVar4 = *src;
  pcVar5 = src;
  if (cVar4 != '\0') {
    ppuVar1 = __ctype_b_loc();
    while (((*ppuVar1)[cVar4] >> 0xd & 1) == 0) {
      if (cVar4 == '.') {
        if ((pcVar5[1] == '.') && (pcVar5[2] == '.')) break;
      }
      else if ((cVar4 == ')') || (cVar4 == ']')) break;
      cVar4 = pcVar5[1];
      pcVar5 = pcVar5 + 1;
      if (cVar4 == '\0') break;
    }
  }
  iVar3 = (int)pcVar5 - (int)src;
  builtin_strncpy(local_38,"%*i%n",6);
  local_3c = 0;
  __isoc99_sscanf(src,"%*lih%n",&local_3c);
  if (local_3c == iVar3) {
    pcVar5 = "%*lih%n";
    if (type != (char *)0x0) {
      *type = 'h';
    }
  }
  else {
    local_3c = 0;
    pcVar5 = "%*d%n";
    __isoc99_sscanf(src,"%*d%n",&local_3c);
    if (local_3c != iVar3) {
      local_3c = 0;
      pcVar5 = "%*ii%n";
      __isoc99_sscanf(src,"%*ii%n",&local_3c);
      if (local_3c != iVar3) {
        local_3c = 0;
        pcVar5 = local_38;
        __isoc99_sscanf(src,pcVar5,&local_3c);
        if (local_3c != iVar3) {
          local_3c = 0;
          __isoc99_sscanf(src,"%*lfd%n",&local_3c);
          if (local_3c == iVar3) {
            pcVar5 = "%*lfd%n";
            if (type != (char *)0x0) {
              *type = 'd';
            }
          }
          else {
            local_3c = 0;
            __isoc99_sscanf(src,"%*ff%n",&local_3c);
            if (local_3c == iVar3) {
              pcVar5 = "%*ff%n";
              if (type != (char *)0x0) {
                *type = 'f';
              }
            }
            else {
              local_3c = 0;
              pcVar5 = (char *)0x0;
              __isoc99_sscanf(src,"%*f%n",&local_3c);
              if (local_3c == iVar3) {
                pcVar5 = "%*f%n";
              }
              if ((type != (char *)0x0) && (local_3c == iVar3)) {
                *type = 'f';
                pcVar5 = "%*f%n";
              }
            }
          }
          goto LAB_0010fc9c;
        }
      }
    }
    if (type != (char *)0x0) {
      *type = 'i';
    }
  }
LAB_0010fc9c:
  pcVar2 = "%*x%n";
  if (pcVar5 != local_38) {
    pcVar2 = pcVar5;
  }
  return pcVar2;
}

Assistant:

static const char* scanf_fmtstr(const char* src, char* type)
{
    const char* end = src;
    // skip to string end, word end or a closing parenthesis
    for(; *end && !isspace(*end) && (*end != ')') && (*end != ']')
               && strncmp(end, "...", 3); ++end);

    int exp = end - src;

    // store type byte in the parameter, or in a temporary variable?
    char tmp;
    char* _type = type ? type : &tmp;

    const char i32[] = "%*"PRIi32"%n";

    const char* r; // result
    int ok = (r = try_fmt(src, exp, "%*"PRIi64"h%n", _type, 'h'))
          || (r = try_fmt(src, exp, "%*d%n", _type, 'i'))
          || (r = try_fmt(src, exp, "%*"PRIi32"i%n", _type, 'i'))
          || (r = try_fmt(src, exp, i32, _type, 'i'))
          || (r = try_fmt(src, exp, "%*lfd%n", _type, 'd'))
          || (r = try_fmt(src, exp, "%*ff%n", _type, 'f'))
          || (r = try_fmt(src, exp, "%*f%n", _type, 'f'));
    (void)ok;
    if(r == i32)
        r = "%*x%n";
    return r;
}